

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O1

void clsolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  uVar5 = 0;
  if (3 < ncol) {
    lVar8 = (long)ldm;
    lVar9 = (long)(ldm * 4 + 4);
    pfVar6 = &rhs[4].i;
    pfVar13 = &M[lVar8 + 4].i;
    pfVar10 = &M[lVar8 * 2 + 4].i;
    pfVar11 = &M[lVar8 * 3 + 4].i;
    uVar5 = 0;
    uVar12 = (ulong)(uint)ncol;
    do {
      uVar12 = uVar12 - 4;
      fVar1 = rhs[uVar5].r;
      fVar2 = rhs[uVar5].i;
      fVar16 = rhs[uVar5 + 1].r - (fVar1 * M[1].r - M[1].i * fVar2);
      fVar14 = rhs[uVar5 + 1].i - (M[1].r * fVar2 + M[1].i * fVar1);
      fVar17 = (rhs[uVar5 + 2].r - (fVar1 * M[2].r - M[2].i * fVar2)) -
               (fVar16 * M[lVar8 + 2].r - M[lVar8 + 2].i * fVar14);
      fVar15 = (rhs[uVar5 + 2].i - (M[2].r * fVar2 + M[2].i * fVar1)) -
               (M[lVar8 + 2].r * fVar14 + M[lVar8 + 2].i * fVar16);
      fVar18 = ((rhs[uVar5 + 3].r - (fVar1 * M[3].r - M[3].i * fVar2)) -
               (fVar16 * M[lVar8 + 3].r - M[lVar8 + 3].i * fVar14)) -
               (fVar17 * M[lVar8 * 2 + 3].r - M[lVar8 * 2 + 3].i * fVar15);
      fVar19 = ((rhs[uVar5 + 3].i - (M[3].r * fVar2 + M[3].i * fVar1)) -
               (M[lVar8 + 3].r * fVar14 + M[lVar8 + 3].i * fVar16)) -
               (M[lVar8 * 2 + 3].r * fVar15 + M[lVar8 * 2 + 3].i * fVar17);
      rhs[uVar5 + 1].r = fVar16;
      rhs[uVar5 + 1].i = fVar14;
      rhs[uVar5 + 2].r = fVar17;
      rhs[uVar5 + 2].i = fVar15;
      rhs[uVar5 + 3].r = fVar18;
      rhs[uVar5 + 3].i = fVar19;
      uVar5 = uVar5 + 4;
      if (uVar5 < (uint)ncol) {
        uVar7 = 0;
        do {
          fVar20 = pfVar6[uVar7 * 2 + -1] - (fVar1 * M[uVar7 + 4].r + M[uVar7 + 4].i * -fVar2);
          fVar21 = pfVar6[uVar7 * 2] - (M[uVar7 + 4].r * fVar2 + M[uVar7 + 4].i * fVar1);
          pfVar6[uVar7 * 2 + -1] = fVar20;
          pfVar6[uVar7 * 2] = fVar21;
          fVar3 = pfVar13[uVar7 * 2 + -1];
          fVar4 = pfVar13[uVar7 * 2];
          fVar20 = fVar20 - (fVar16 * fVar3 + fVar4 * -fVar14);
          pfVar6[uVar7 * 2 + -1] = fVar20;
          fVar21 = fVar21 - (fVar3 * fVar14 + fVar4 * fVar16);
          pfVar6[uVar7 * 2] = fVar21;
          fVar3 = pfVar10[uVar7 * 2 + -1];
          fVar4 = pfVar10[uVar7 * 2];
          fVar20 = fVar20 - (fVar17 * fVar3 + fVar4 * -fVar15);
          pfVar6[uVar7 * 2 + -1] = fVar20;
          fVar21 = fVar21 - (fVar3 * fVar15 + fVar4 * fVar17);
          pfVar6[uVar7 * 2] = fVar21;
          fVar3 = pfVar11[uVar7 * 2 + -1];
          fVar4 = pfVar11[uVar7 * 2];
          pfVar6[uVar7 * 2 + -1] = fVar20 - (fVar18 * fVar3 + fVar4 * -fVar19);
          pfVar6[uVar7 * 2] = fVar21 - (fVar3 * fVar19 + fVar4 * fVar18);
          uVar7 = uVar7 + 1;
        } while (uVar12 != uVar7);
      }
      M = M + lVar9;
      pfVar6 = pfVar6 + 8;
      pfVar13 = pfVar13 + lVar9 * 2;
      pfVar10 = pfVar10 + lVar9 * 2;
      pfVar11 = pfVar11 + lVar9 * 2;
    } while ((long)uVar5 < (long)(ncol + -3));
  }
  if ((int)(uint)uVar5 < ncol + -1) {
    uVar12 = uVar5 & 0xffffffff;
    fVar1 = rhs[uVar12].r;
    fVar2 = rhs[uVar12].i;
    uVar7 = uVar12 | 1;
    fVar14 = rhs[uVar7].r - (fVar1 * M[1].r - M[1].i * fVar2);
    fVar15 = rhs[uVar7].i - (M[1].r * fVar2 + M[1].i * fVar1);
    rhs[uVar7].r = fVar14;
    rhs[uVar12 + 1].i = fVar15;
    if ((int)((uint)uVar5 | 2) < ncol) {
      lVar8 = 0;
      do {
        fVar18 = rhs[uVar12 + lVar8 + 2].r - (fVar1 * M[lVar8 + 2].r + M[lVar8 + 2].i * -fVar2);
        fVar19 = rhs[uVar12 + lVar8 + 2].i - (M[lVar8 + 2].r * fVar2 + M[lVar8 + 2].i * fVar1);
        rhs[uVar12 + lVar8 + 2].r = fVar18;
        rhs[uVar12 + lVar8 + 2].i = fVar19;
        fVar16 = M[(long)ldm + lVar8 + 2].r;
        fVar17 = M[(long)ldm + lVar8 + 2].i;
        rhs[uVar12 + lVar8 + 2].r = fVar18 - (fVar14 * fVar16 + fVar17 * -fVar15);
        rhs[uVar12 + lVar8 + 2].i = fVar19 - (fVar16 * fVar15 + fVar17 * fVar14);
        lVar8 = lVar8 + 1;
      } while (((uint)ncol - uVar12) + -2 != lVar8);
    }
  }
  return;
}

Assistant:

void clsolve ( int ldm, int ncol, singlecomplex *M, singlecomplex *rhs )
{
    int k;
    singlecomplex x0, x1, x2, x3, temp;
    singlecomplex *M0;
    singlecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	cc_mult(&temp, &x0, Mki0); Mki0++;
      	c_sub(&x1, &rhs[firstcol+1], &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x2, &rhs[firstcol+2], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x2, &x2, &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x3, &rhs[firstcol+3], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x3, &x3, &temp);
	cc_mult(&temp, &x2, Mki2); Mki2++;
	c_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x2, Mki2); Mki2++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x3, Mki3); Mki3++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}